

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O3

char * helicsFilterGetTag(HelicsFilter filt,char *tagname)

{
  Interface *this;
  size_t sVar1;
  string *psVar2;
  _Alloc_hider _Var3;
  string_view tag;
  long *local_38;
  size_t local_30;
  long local_28 [2];
  
  _Var3._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
  if ((filt != (HelicsFilter)0x0) && (*(int *)((long)filt + 4) == -0x13d9fed9)) {
    this = *(Interface **)((long)filt + 8);
    local_38 = local_28;
    if (tagname == (char *)0x0) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p,
                 gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p +
                 gHelicsEmptyStr_abi_cxx11_._M_string_length);
    }
    else {
      sVar1 = strlen(tagname);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,tagname,tagname + sVar1);
    }
    tag._M_str = (char *)local_38;
    tag._M_len = local_30;
    psVar2 = helics::Interface::getTag_abi_cxx11_(this,tag);
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
    _Var3._M_p = (psVar2->_M_dataplus)._M_p;
  }
  return _Var3._M_p;
}

Assistant:

const char* helicsFilterGetTag(HelicsFilter filt, const char* tagname)
{
    auto* filtObj = getFilterObj(filt, nullptr);
    if (filtObj == nullptr) {
        return gHelicsEmptyStr.c_str();
    }
    try {
        const std::string& info = filtObj->filtPtr->getTag(AS_STRING(tagname));
        return info.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        return gHelicsEmptyStr.c_str();
    }
    // LCOV_EXCL_STOP
}